

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O3

bool __thiscall
Js::WebAssemblySharedArrayBuffer::GrowMemory
          (WebAssemblySharedArrayBuffer *this,uint32 newBufferLength)

{
  uint uVar1;
  Type pSVar2;
  BYTE *pBVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  undefined4 *puVar7;
  Recycler *pRVar8;
  LPVOID pvVar9;
  ulong size;
  AutoExternalAllocation local_50;
  RecyclableObject *local_38;
  
  pSVar2 = (this->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.sharedContents;
  uVar1 = pSVar2->bufferLength;
  if ((newBufferLength < uVar1) || (pSVar2->maxBufferLength < newBufferLength)) {
    if (pSVar2->maxBufferLength < newBufferLength) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                  ,0x23a,"(newBufferLength <= sharedContents->maxBufferLength)",
                                  "This shouldn\'t happen");
      if (!bVar5) goto LAB_00d4badb;
      *puVar7 = 0;
    }
    else {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x23b,"((0))","UNREACHED");
    if (bVar5) {
      *puVar7 = 0;
      JavascriptError::ThrowTypeError
                ((((((this->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.
                     super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.type.ptr)->
                   javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
                 -0x7ff5e492,(PCWSTR)0x0);
    }
LAB_00d4badb:
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  }
  if (newBufferLength - uVar1 == 0) {
    return true;
  }
  pBVar3 = pSVar2->buffer;
  if (pBVar3 == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    local_38 = (RecyclableObject *)this;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x247,"(buffer)","buffer");
    if (!bVar5) goto LAB_00d4badb;
    *puVar7 = 0;
    this = (WebAssemblySharedArrayBuffer *)local_38;
  }
  iVar6 = (*(((RecyclableObject *)this)->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x73])(this);
  size = (ulong)(newBufferLength - uVar1);
  if ((char)iVar6 == '\0') {
LAB_00d4b9e4:
    memset(pBVar3 + uVar1,0,size);
    *(uint32 *)&(((((RecyclableObject *)((long)this + 0x20))->type).ptr)->prototype).ptr =
         newBufferLength;
    bVar5 = true;
  }
  else {
    local_38 = (RecyclableObject *)this;
    pRVar8 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    bVar5 = Memory::Recycler::RequestExternalMemoryAllocation(pRVar8,size);
    if (bVar5) {
LAB_00d4b99a:
      local_50.allocationSucceeded = false;
      local_50.recycler = pRVar8;
      local_50.size = size;
      pvVar9 = VirtualAlloc(pBVar3 + uVar1,size,0x1000,4);
      this = (WebAssemblySharedArrayBuffer *)local_38;
      if (pvVar9 != (LPVOID)0x0) {
        local_50.allocationSucceeded = true;
        anon_func::AutoExternalAllocation::~AutoExternalAllocation(&local_50);
        pRVar8 = RecyclableObject::GetRecycler((RecyclableObject *)this);
        Memory::Recycler::AddExternalMemoryUsage(pRVar8,size);
        goto LAB_00d4b9e4;
      }
      anon_func::AutoExternalAllocation::~AutoExternalAllocation(&local_50);
    }
    else {
      Memory::Recycler::CollectNow<(Memory::CollectionFlags)404852739>(pRVar8);
      bVar5 = Memory::Recycler::RequestExternalMemoryAllocation(pRVar8,size);
      if (bVar5) goto LAB_00d4b99a;
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

_Must_inspect_result_ bool WebAssemblySharedArrayBuffer::GrowMemory(uint32 newBufferLength)
    {
        uint32 bufferLength = sharedContents->bufferLength;
        BYTE* buffer = sharedContents->buffer;
        if (newBufferLength < bufferLength || newBufferLength > sharedContents->maxBufferLength)
        {
            AssertMsg(newBufferLength <= sharedContents->maxBufferLength, "This shouldn't happen");
            Assert(UNREACHED);
            JavascriptError::ThrowTypeError(GetScriptContext(), WASMERR_BufferGrowOnly);
        }

        uint32 growSize = newBufferLength - bufferLength;

        // We're not growing the buffer, do nothing
        if (growSize == 0)
        {
            return true;
        }

        AssertOrFailFast(buffer);
        if (IsValidVirtualBufferLength(newBufferLength))
        {
            auto virtualAllocFunc = [=]
            {
                return !!VirtualAlloc(buffer + bufferLength, growSize, MEM_COMMIT, PAGE_READWRITE);
            };
            if (!this->GetRecycler()->DoExternalAllocation(growSize, virtualAllocFunc))
            {
                return false;
            }

            this->GetRecycler()->AddExternalMemoryUsage(growSize);
        }
        else
        {
            // We have already allocated maxLength in the heap if we're not using virtual alloc
        }
        ZeroMemory(buffer + bufferLength, growSize);
        sharedContents->bufferLength = newBufferLength;
        ValidateBuffer();
        return true;
    }